

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_children(xml_node *this)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_allocator *this_00;
  xml_node_struct *next;
  xml_node_struct *cur;
  xml_allocator *alloc;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
    bVar2 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar2) {
      next = this->_root->first_child;
      while (next != (xml_node_struct *)0x0) {
        pxVar1 = next->next_sibling;
        impl::anon_unknown_0::destroy_node(next,this_00);
        next = pxVar1;
      }
      this->_root->first_child = (xml_node_struct *)0x0;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_children()
	{
		if (!_root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		for (xml_node_struct* cur = _root->first_child; cur; )
		{
			xml_node_struct* next = cur->next_sibling;

			impl::destroy_node(cur, alloc);

			cur = next;
		}

		_root->first_child = NULL;

		return true;
	}